

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall
Symbol_Table::set_function_data(Symbol_Table *this,string *name,string *kind,int n_args)

{
  int iVar1;
  mapped_type pFVar2;
  mapped_type *ppFVar3;
  
  pFVar2 = (mapped_type)operator_new(0x90);
  (pFVar2->super_IdentifierData).type._M_dataplus._M_p =
       (pointer)&(pFVar2->super_IdentifierData).type.field_2;
  (pFVar2->super_IdentifierData).type._M_string_length = 0;
  (pFVar2->super_IdentifierData).type.field_2._M_local_buf[0] = '\0';
  (pFVar2->super_IdentifierData).kind._M_dataplus._M_p =
       (pointer)&(pFVar2->super_IdentifierData).kind.field_2;
  (pFVar2->super_IdentifierData).kind._M_string_length = 0;
  (pFVar2->super_IdentifierData).kind.field_2._M_local_buf[0] = '\0';
  (pFVar2->type)._M_dataplus._M_p = (pointer)&(pFVar2->type).field_2;
  (pFVar2->type)._M_string_length = 0;
  (pFVar2->type).field_2._M_local_buf[0] = '\0';
  (pFVar2->kind)._M_dataplus._M_p = (pointer)&(pFVar2->kind).field_2;
  (pFVar2->kind)._M_string_length = 0;
  (pFVar2->kind).field_2._M_local_buf[0] = '\0';
  ppFVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionIdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionIdentifierData_*>_>_>
            ::operator[](&this->functions,name);
  *ppFVar3 = pFVar2;
  iVar1 = std::__cxx11::string::compare((char *)kind);
  if (iVar1 == 0) {
    iVar1 = this->method_count;
    this->method_count = iVar1 + 1;
  }
  else {
    iVar1 = this->function_count;
    this->function_count = iVar1 + 1;
  }
  pFVar2->index = iVar1;
  pFVar2->n_args = n_args;
  std::__cxx11::string::_M_assign((string *)&pFVar2->kind);
  return;
}

Assistant:

void Symbol_Table::set_function_data(const std::string& name, const std::string& kind, int n_args) {
    auto* identifier_data = new FunctionIdentifierData;
    functions[name] = identifier_data;

    if (kind == "method") {
        identifier_data->index = method_count++;
    }
    else {
        identifier_data->index = function_count++;
    }
    identifier_data->n_args = n_args;
    identifier_data->kind = kind;
}